

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void place_object(chunk_conflict *c,loc grid,wchar_t level,_Bool good,_Bool great,uint8_t origin,
                 wchar_t tval)

{
  _Bool _Var1;
  uint8_t uVar2;
  int iVar3;
  _Bool local_31;
  uint32_t sqrating;
  _Bool dummy;
  object *new_obj;
  uint8_t local_1f;
  byte local_1e;
  byte local_1d;
  int32_t rating;
  uint8_t origin_local;
  _Bool great_local;
  _Bool good_local;
  chunk *pcStack_18;
  wchar_t level_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  new_obj._4_4_ = 0;
  local_31 = true;
  local_1f = origin;
  local_1e = great;
  local_1d = good;
  rating = level;
  pcStack_18 = (chunk *)c;
  c_local = (chunk_conflict *)grid;
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if (((_Var1) && (_Var1 = square_canputitem(pcStack_18,(loc_conflict)c_local), _Var1)) &&
     (_sqrating = make_object(pcStack_18,rating,(_Bool)(local_1d & 1),(_Bool)(local_1e & 1),false,
                              (int32_t *)((long)&new_obj + 4),tval), _sqrating != (object *)0x0)) {
    _sqrating->origin = local_1f;
    uVar2 = convert_depth_to_origin(pcStack_18->depth);
    _sqrating->origin_depth = uVar2;
    _sqrating->origin_place = player->place;
    _Var1 = floor_carry(pcStack_18,(loc_conflict)c_local,_sqrating,&local_31);
    if (_Var1) {
      list_object((chunk_conflict *)pcStack_18,_sqrating);
      if (_sqrating->artifact != (artifact *)0x0) {
        pcStack_18->good_item = true;
      }
      if (new_obj._4_4_ < 0x2625a1) {
        if (new_obj._4_4_ < -2500000) {
          new_obj._4_4_ = -2500000;
        }
      }
      else {
        new_obj._4_4_ = 2500000;
      }
      iVar3 = (new_obj._4_4_ / 100) * (new_obj._4_4_ / 100);
      if (pcStack_18->obj_rating < -iVar3 - 1U) {
        pcStack_18->obj_rating = iVar3 + pcStack_18->obj_rating;
      }
      else {
        pcStack_18->obj_rating = 0xffffffff;
      }
    }
    else {
      if (_sqrating->artifact != (artifact *)0x0) {
        mark_artifact_created(_sqrating->artifact,false);
      }
      object_delete(pcStack_18,(chunk *)0x0,(object **)&sqrating);
    }
  }
  return;
}

Assistant:

void place_object(struct chunk *c, struct loc grid, int level, bool good,
		bool great, uint8_t origin, int tval)
{
	int32_t rating = 0;
	struct object *new_obj;
	bool dummy = true;

	if (!square_in_bounds(c, grid)) return;
	if (!square_canputitem(c, grid)) return;

	/* Make an appropriate object */
	new_obj = make_object(c, level, good, great, false, &rating, tval);
	if (!new_obj) return;
	new_obj->origin = origin;
	new_obj->origin_depth = convert_depth_to_origin(c->depth);
	new_obj->origin_place = player->place;

	/* Give it to the floor */
	if (!floor_carry(c, grid, new_obj, &dummy)) {
		if (new_obj->artifact) {
			mark_artifact_created(new_obj->artifact, false);
		}
		object_delete(c, NULL, &new_obj);
		return;
	} else {
		uint32_t sqrating;

		list_object(c, new_obj);
		if (new_obj->artifact) {
			c->good_item = true;
		}
		/* Avoid overflows */
		if (rating > 2500000) {
			rating = 2500000;
		} else if (rating < -2500000) {
			rating = -2500000;
		}
		sqrating = (rating / 100) * (rating / 100);
		if (c->obj_rating < UINT32_MAX - sqrating) {
			c->obj_rating += sqrating;
		} else {
			c->obj_rating = UINT32_MAX;
		}
	}
}